

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp_mkdir.c
# Opt level: O1

int main(int argc,char **argv)

{
  in_addr_t iVar1;
  uint uVar2;
  int __fd;
  int iVar3;
  long lVar4;
  sockaddr_in sin;
  long local_38;
  sockaddr local_30;
  
  iVar1 = 0x100007f;
  if (1 < argc) {
    iVar1 = inet_addr(argv[1]);
  }
  if (2 < argc) {
    username = argv[2];
  }
  if (3 < argc) {
    password = argv[3];
  }
  if (4 < argc) {
    sftppath = argv[4];
  }
  uVar2 = libssh2_init(0);
  if (uVar2 != 0) {
    fprintf(_stderr,"libssh2 initialization failed (%d)\n",(ulong)uVar2);
    return 1;
  }
  __fd = socket(2,1,0);
  if (__fd == -1) {
    main_cold_4();
  }
  else {
    local_30.sa_family = 2;
    local_30.sa_data[0] = '\0';
    local_30.sa_data[1] = '\x16';
    local_30.sa_data._2_4_ = iVar1;
    iVar3 = connect(__fd,&local_30,0x10);
    if (iVar3 == 0) {
      lVar4 = libssh2_session_init_ex(0,0,0,0);
      if (lVar4 != 0) {
        uVar2 = libssh2_session_handshake(lVar4,__fd);
        if (uVar2 == 0) {
          main_cold_2();
          lVar4 = local_38;
        }
        else {
          fprintf(_stderr,"Failure establishing SSH session: %d\n",(ulong)uVar2);
        }
        goto LAB_00101505;
      }
      main_cold_3();
    }
    else {
      main_cold_1();
    }
  }
  lVar4 = 0;
LAB_00101505:
  if (lVar4 != 0) {
    libssh2_session_disconnect_ex(lVar4,0xb,"Normal Shutdown","");
    libssh2_session_free(lVar4);
  }
  if (__fd != -1) {
    shutdown(__fd,2);
    close(__fd);
  }
  fwrite("all done\n",9,1,_stderr);
  libssh2_exit();
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    uint32_t hostaddr;
    libssh2_socket_t sock;
    int i, auth_pw = 1;
    struct sockaddr_in sin;
    const char *fingerprint;
    int rc;
    LIBSSH2_SESSION *session = NULL;
    LIBSSH2_SFTP *sftp_session;

#ifdef _WIN32
    WSADATA wsadata;

    rc = WSAStartup(MAKEWORD(2, 0), &wsadata);
    if(rc) {
        fprintf(stderr, "WSAStartup failed with error: %d\n", rc);
        return 1;
    }
#endif

    if(argc > 1) {
        hostaddr = inet_addr(argv[1]);
    }
    else {
        hostaddr = htonl(0x7F000001);
    }
    if(argc > 2) {
        username = argv[2];
    }
    if(argc > 3) {
        password = argv[3];
    }
    if(argc > 4) {
        sftppath = argv[4];
    }

    rc = libssh2_init(0);
    if(rc) {
        fprintf(stderr, "libssh2 initialization failed (%d)\n", rc);
        return 1;
    }

    /*
     * The application code is responsible for creating the socket
     * and establishing the connection
     */
    sock = socket(AF_INET, SOCK_STREAM, 0);
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "failed to create socket.\n");
        goto shutdown;
    }

    sin.sin_family = AF_INET;
    sin.sin_port = htons(22);
    sin.sin_addr.s_addr = hostaddr;
    if(connect(sock, (struct sockaddr*)(&sin), sizeof(struct sockaddr_in))) {
        fprintf(stderr, "failed to connect.\n");
        goto shutdown;
    }

    /* Create a session instance */
    session = libssh2_session_init();
    if(!session) {
        fprintf(stderr, "Could not initialize SSH session.\n");
        goto shutdown;
    }

    /* ... start it up. This will trade welcome banners, exchange keys,
     * and setup crypto, compression, and MAC layers
     */
    rc = libssh2_session_handshake(session, sock);
    if(rc) {
        fprintf(stderr, "Failure establishing SSH session: %d\n", rc);
        goto shutdown;
    }

    /* At this point we have not yet authenticated.  The first thing to do
     * is check the hostkey's fingerprint against our known hosts Your app
     * may have it hard coded, may go to a file, may present it to the
     * user, that's your call
     */
    fingerprint = libssh2_hostkey_hash(session, LIBSSH2_HOSTKEY_HASH_SHA1);
    fprintf(stderr, "Fingerprint: ");
    for(i = 0; i < 20; i++) {
        fprintf(stderr, "%02X ", (unsigned char)fingerprint[i]);
    }
    fprintf(stderr, "\n");

    if(auth_pw) {
        /* We could authenticate via password */
        if(libssh2_userauth_password(session, username, password)) {
            fprintf(stderr, "Authentication by password failed.\n");
            goto shutdown;
        }
    }
    else {
        /* Or by public key */
        if(libssh2_userauth_publickey_fromfile(session, username,
                                               pubkey, privkey,
                                               password)) {
            fprintf(stderr, "Authentication by public key failed.\n");
            goto shutdown;
        }
    }

    sftp_session = libssh2_sftp_init(session);

    if(!sftp_session) {
        fprintf(stderr, "Unable to init SFTP session\n");
        goto shutdown;
    }

    /* Since we have not set non-blocking, tell libssh2 we are blocking */
    libssh2_session_set_blocking(session, 1);

    /* Make a directory via SFTP */
    rc = libssh2_sftp_mkdir(sftp_session, sftppath,
                            LIBSSH2_SFTP_S_IRWXU |
                            LIBSSH2_SFTP_S_IRGRP |
                            LIBSSH2_SFTP_S_IXGRP |
                            LIBSSH2_SFTP_S_IROTH |
                            LIBSSH2_SFTP_S_IXOTH);
    if(rc)
        fprintf(stderr, "libssh2_sftp_mkdir failed: %d\n", rc);

    libssh2_sftp_shutdown(sftp_session);

shutdown:

    if(session) {
        libssh2_session_disconnect(session, "Normal Shutdown");
        libssh2_session_free(session);
    }

    if(sock != LIBSSH2_INVALID_SOCKET) {
        shutdown(sock, 2);
        LIBSSH2_SOCKET_CLOSE(sock);
    }

    fprintf(stderr, "all done\n");

    libssh2_exit();

#ifdef _WIN32
    WSACleanup();
#endif

    return 0;
}